

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O1

Symbol * sym_AddEqu(char *symName,int32_t value)

{
  Symbol *pSVar1;
  
  pSVar1 = createNonrelocSymbol(symName,true);
  if (pSVar1 == (Symbol *)0x0) {
    pSVar1 = (Symbol *)0x0;
  }
  else {
    pSVar1->type = SYM_EQU;
    (pSVar1->field_8).value = value;
  }
  return pSVar1;
}

Assistant:

struct Symbol *sym_AddEqu(char const *symName, int32_t value)
{
	struct Symbol *sym = createNonrelocSymbol(symName, true);

	if (!sym)
		return NULL;

	sym->type = SYM_EQU;
	sym->value = value;

	return sym;
}